

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ares_update_servers.c
# Opt level: O0

ares_status_t
ares_sconfig_append_fromstr
          (ares_channel_t *channel,ares_llist_t **sconfig,char *str,ares_bool_t ignore_invalid)

{
  size_t data_len;
  ares_buf_t **ppaVar1;
  undefined8 *puVar2;
  undefined1 local_84 [8];
  ares_sconfig_t s;
  ares_buf_t *entry;
  ares_buf_t **bufptr;
  size_t i;
  size_t num;
  ares_array_t *list;
  ares_buf_t *buf;
  ares_status_t status;
  ares_bool_t ignore_invalid_local;
  char *str_local;
  ares_llist_t **sconfig_local;
  ares_channel_t *channel_local;
  
  buf._0_4_ = 0;
  list = (ares_array_t *)0x0;
  num = 0;
  buf._4_4_ = ignore_invalid;
  _status = str;
  str_local = (char *)sconfig;
  sconfig_local = (ares_llist_t **)channel;
  data_len = ares_strlen(str);
  list = (ares_array_t *)ares_buf_create_const((uchar *)str,data_len);
  if ((ares_buf_t *)list == (ares_buf_t *)0x0) {
    buf._0_4_ = ARES_ENOMEM;
  }
  else {
    buf._0_4_ = ares_buf_split((ares_buf_t *)list,(uchar *)" ,",2,ARES_BUF_SPLIT_NONE,0,
                               (ares_array_t **)&num);
    if ((ares_status_t)buf == ARES_SUCCESS) {
      ppaVar1 = (ares_buf_t **)ares_array_len((ares_array_t *)num);
      for (bufptr = (ares_buf_t **)0x0; bufptr < ppaVar1; bufptr = (ares_buf_t **)((long)bufptr + 1)
          ) {
        puVar2 = (undefined8 *)ares_array_at((ares_array_t *)num,(size_t)bufptr);
        s._36_8_ = *puVar2;
        buf._0_4_ = parse_nameserver_uri((ares_buf_t *)s._36_8_,(ares_sconfig_t *)local_84);
        if ((ares_status_t)buf != ARES_SUCCESS) {
          buf._0_4_ = parse_nameserver((ares_buf_t *)s._36_8_,(ares_sconfig_t *)local_84);
        }
        if ((ares_status_t)buf == ARES_SUCCESS) {
          buf._0_4_ = ares_sconfig_append((ares_channel_t *)sconfig_local,(ares_llist_t **)str_local
                                          ,(ares_addr *)local_84,s.addr.addr._10_2_,
                                          s.addr.addr._8_2_,(char *)((long)&s.addr.addr + 0xc));
          if ((ares_status_t)buf != ARES_SUCCESS) goto LAB_0011ff5b;
          buf._0_4_ = ARES_SUCCESS;
        }
        else if (buf._4_4_ == ARES_FALSE) goto LAB_0011ff5b;
      }
      buf._0_4_ = ARES_SUCCESS;
    }
  }
LAB_0011ff5b:
  ares_array_destroy((ares_array_t *)num);
  ares_buf_destroy((ares_buf_t *)list);
  return (ares_status_t)buf;
}

Assistant:

ares_status_t ares_sconfig_append_fromstr(const ares_channel_t *channel,
                                          ares_llist_t        **sconfig,
                                          const char           *str,
                                          ares_bool_t           ignore_invalid)
{
  ares_status_t status = ARES_SUCCESS;
  ares_buf_t   *buf    = NULL;
  ares_array_t *list   = NULL;
  size_t        num;
  size_t        i;

  /* On Windows, there may be more than one nameserver specified in the same
   * registry key, so we parse input as a space or comma separated list.
   */
  buf = ares_buf_create_const((const unsigned char *)str, ares_strlen(str));
  if (buf == NULL) {
    status = ARES_ENOMEM;
    goto done;
  }

  status = ares_buf_split(buf, (const unsigned char *)" ,", 2,
                          ARES_BUF_SPLIT_NONE, 0, &list);
  if (status != ARES_SUCCESS) {
    goto done;
  }

  num = ares_array_len(list);
  for (i = 0; i < num; i++) {
    ares_buf_t   **bufptr = ares_array_at(list, i);
    ares_buf_t    *entry  = *bufptr;
    ares_sconfig_t s;

    status = parse_nameserver_uri(entry, &s);
    if (status != ARES_SUCCESS) {
      status = parse_nameserver(entry, &s);
    }

    if (status != ARES_SUCCESS) {
      if (ignore_invalid) {
        continue;
      } else {
        goto done;
      }
    }

    status = ares_sconfig_append(channel, sconfig, &s.addr, s.udp_port,
                                 s.tcp_port, s.ll_iface);
    if (status != ARES_SUCCESS) {
      goto done; /* LCOV_EXCL_LINE: OutOfMemory */
    }
  }

  status = ARES_SUCCESS;

done:
  ares_array_destroy(list);
  ares_buf_destroy(buf);
  return status;
}